

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cc
# Opt level: O2

void __thiscall tt::net::EventLoop::handleRead(EventLoop *this)

{
  ssize_t v;
  LogStream *pLVar1;
  Logger local_1000;
  undefined8 local_28;
  uint64_t one;
  
  local_28 = 1;
  v = readn(this->m_wakeupFd,&local_28,8);
  if (v != 8) {
    Logger::Logger(&local_1000,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/EventLoop.cc"
                   ,0x65);
    pLVar1 = LogStream::operator<<((LogStream *)&local_1000,"EventLoop::handleRead() reads ");
    pLVar1 = LogStream::operator<<(pLVar1,v);
    LogStream::operator<<(pLVar1,"bytes instead of 8");
    Logger::~Logger(&local_1000);
  }
  ((this->m_wakeupChannel).super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->m_events = 0x80000001;
  return;
}

Assistant:

void EventLoop::handleRead(){

	uint64_t one = 1;
	ssize_t n = readn(m_wakeupFd, &one, sizeof(one));

	if(n != sizeof(one)){
		LOG << "EventLoop::handleRead() reads " << n << "bytes instead of 8";
	}

	m_wakeupChannel->setEvents(EPOLLIN | EPOLLET);
}